

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32Fallback(CodedInputStream *this,uint32 *value)

{
  long lVar1;
  byte *pbVar2;
  bool bVar3;
  byte *pbVar4;
  uint uVar5;
  long lVar6;
  
  pbVar2 = this->buffer_;
  pbVar4 = this->buffer_end_;
  if (((int)pbVar4 - (int)pbVar2 < 10) && ((pbVar4 <= pbVar2 || ((char)pbVar4[-1] < '\0')))) {
    bVar3 = ReadVarint32Slow(this,value);
    return bVar3;
  }
  uVar5 = *pbVar2 & 0x7f;
  if ((char)*pbVar2 < '\0') {
    uVar5 = uVar5 | (pbVar2[1] & 0x7f) << 7;
    if ((char)pbVar2[1] < '\0') {
      uVar5 = uVar5 | (pbVar2[2] & 0x7f) << 0xe;
      if ((char)pbVar2[2] < '\0') {
        uVar5 = uVar5 | (pbVar2[3] & 0x7f) << 0x15;
        if ((char)pbVar2[3] < '\0') {
          pbVar4 = pbVar2 + 5;
          uVar5 = uVar5 | (uint)pbVar2[4] << 0x1c;
          if ((char)pbVar2[4] < '\0') {
            lVar6 = 0;
            do {
              if ((int)lVar6 == 5) {
                return false;
              }
              lVar1 = lVar6 + 1;
              pbVar2 = pbVar4 + lVar6;
              lVar6 = lVar1;
            } while ((char)*pbVar2 < '\0');
            pbVar4 = pbVar4 + lVar1;
          }
        }
        else {
          pbVar4 = pbVar2 + 4;
        }
      }
      else {
        pbVar4 = pbVar2 + 3;
      }
    }
    else {
      pbVar4 = pbVar2 + 2;
    }
  }
  else {
    pbVar4 = pbVar2 + 1;
  }
  *value = uVar5;
  this->buffer_ = pbVar4;
  return true;
}

Assistant:

inline int CodedInputStream::BufferSize() const {
  return buffer_end_ - buffer_;
}